

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)

{
  SQWeakRef *pSVar1;
  SQClosure *pSVar2;
  SQNativeClosure *c_1;
  SQClosure *c;
  SQObjectPtr ret;
  SQWeakRef *w;
  SQObjectPtr *env;
  SQObjectPtr *o;
  undefined4 in_stack_ffffffffffffff88;
  SQObjectType in_stack_ffffffffffffff8c;
  HSQUIRRELVM in_stack_ffffffffffffff90;
  SQNativeClosure *in_stack_ffffffffffffff98;
  SQClosure *x;
  SQNativeClosure *in_stack_ffffffffffffffa0;
  HSQUIRRELVM this;
  SQClosure *in_stack_ffffffffffffffb0;
  SQObjectPtr local_40;
  SQWeakRef *local_30;
  SQObjectPtr *local_28;
  SQObjectPtr *local_20;
  SQRESULT local_8;
  
  local_20 = stack_get(in_stack_ffffffffffffff90,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (((local_20->super_SQObject)._type == OT_NATIVECLOSURE) ||
     ((local_20->super_SQObject)._type == OT_CLOSURE)) {
    local_28 = stack_get(in_stack_ffffffffffffff90,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (((local_28->super_SQObject)._type == OT_TABLE) ||
       ((((local_28->super_SQObject)._type == OT_ARRAY ||
         ((local_28->super_SQObject)._type == OT_CLASS)) ||
        ((local_28->super_SQObject)._type == OT_INSTANCE)))) {
      local_30 = SQRefCounted::GetWeakRef
                           ((SQRefCounted *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      SQObjectPtr::SQObjectPtr(&local_40);
      if ((local_20->super_SQObject)._type == OT_CLOSURE) {
        pSVar2 = SQClosure::Clone(in_stack_ffffffffffffffb0);
        x = pSVar2;
        if (pSVar2->_env != (SQWeakRef *)0x0) {
          (pSVar2->_env->super_SQRefCounted)._uiRef = (pSVar2->_env->super_SQRefCounted)._uiRef - 1;
          if ((pSVar2->_env->super_SQRefCounted)._uiRef == 0) {
            (*(pSVar2->_env->super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          pSVar2->_env = (SQWeakRef *)0x0;
        }
        pSVar2->_env = local_30;
        (pSVar2->_env->super_SQRefCounted)._uiRef = (pSVar2->_env->super_SQRefCounted)._uiRef + 1;
        if (((local_20->super_SQObject)._unVal.pTable)->_nodes != (_HashNode *)0x0) {
          pSVar2->_base = (SQClass *)((local_20->super_SQObject)._unVal.pTable)->_nodes;
          (pSVar2->_base->super_SQCollectable).super_SQRefCounted._uiRef =
               (pSVar2->_base->super_SQCollectable).super_SQRefCounted._uiRef + 1;
        }
        SQObjectPtr::operator=((SQObjectPtr *)in_stack_ffffffffffffffa0,x);
      }
      else {
        in_stack_ffffffffffffff90 = (HSQUIRRELVM)SQNativeClosure::Clone(in_stack_ffffffffffffffa0);
        this = in_stack_ffffffffffffff90;
        if (*(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject !=
            (SQWeakRef *)0x0) {
          pSVar1 = *(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject;
          (pSVar1->super_SQRefCounted)._uiRef = (pSVar1->super_SQRefCounted)._uiRef - 1;
          if (((*(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject)->
              super_SQRefCounted)._uiRef == 0) {
            (*((*(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject)->
              super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          *(SQWeakRef **)&(this->_roottable).super_SQObject = (SQWeakRef *)0x0;
        }
        *(SQWeakRef **)&(this->_roottable).super_SQObject = local_30;
        pSVar1 = *(SQWeakRef **)&(this->_roottable).super_SQObject;
        (pSVar1->super_SQRefCounted)._uiRef = (pSVar1->super_SQRefCounted)._uiRef + 1;
        SQObjectPtr::operator=((SQObjectPtr *)this,in_stack_ffffffffffffff98);
      }
      SQVM::Pop((SQVM *)0x115f07);
      SQVM::Push(in_stack_ffffffffffffff90,
                 (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_8 = 0;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
    }
    else {
      local_8 = sq_throwerror(in_stack_ffffffffffffff90,
                              (SQChar *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffff90,
                            (SQChar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
    ;
  }
  return local_8;
}

Assistant:

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    SQObjectPtr &env = stack_get(v,-1);
    if(!sq_istable(env) &&
        !sq_isarray(env) &&
        !sq_isclass(env) &&
        !sq_isinstance(env))
        return sq_throwerror(v,_SC("invalid environment"));
    SQWeakRef *w = _refcounted(env)->GetWeakRef(sq_type(env));
    SQObjectPtr ret;
    if(sq_isclosure(o)) {
        SQClosure *c = _closure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        if(_closure(o)->_base) {
            c->_base = _closure(o)->_base;
            __ObjAddRef(c->_base);
        }
        ret = c;
    }
    else { //then must be a native closure
        SQNativeClosure *c = _nativeclosure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        ret = c;
    }
    v->Pop();
    v->Push(ret);
    return SQ_OK;
}